

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall
imrt::Station::Station
          (Station *this,Collimator *collimator,
          vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _angle,int max_apertures,
          int max_intensity,int initial_intensity,int step_intensity,int open_apertures,int setup,
          fstream *myfile)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pVVar6;
  Matrix *pMVar7;
  mapped_type *ppMVar8;
  int j;
  long lVar9;
  int i;
  long lVar10;
  pointer pVVar11;
  int i_1;
  uint uVar12;
  int a;
  Matrix local_98;
  int local_84;
  vector<double,_std::allocator<double>_> *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  Matrix *local_70;
  map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
  *local_68;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_60;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *local_58;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_50;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_48;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *local_40;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_38;
  
  this->_vptr_Station = (_func_int **)&PTR__Station_00130cc0;
  this->angle = _angle;
  p_Var1 = &(this->D)._M_t._M_impl.super__Rb_tree_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = &this->D;
  this->max_apertures = max_apertures;
  this->max_intensity = max_intensity;
  this->initial_intensity = initial_intensity;
  this->step_intensity = step_intensity;
  local_40 = &this->A;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(local_40,(long)max_apertures,(allocator_type *)&local_98);
  (this->last_mem).first.first = 0;
  (this->last_mem).first.second = 0;
  (this->last_mem).second.first = 0;
  (this->last_mem).second.second = 0;
  local_48 = &this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_48;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)local_48;
  local_78 = &this->last_intensity;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collimator = collimator;
  local_70 = &this->I;
  maths::Matrix::Matrix(local_70);
  local_80 = &this->intensity;
  std::vector<double,_std::allocator<double>_>::vector
            (local_80,(long)max_apertures,(allocator_type *)&local_98);
  p_Var1 = &(this->pos2beam)._M_t._M_impl.super__Rb_tree_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = &this->last_mem;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50 = &this->pos2beam;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58 = &this->beam2pos;
  p_Var1 = &(this->beam2pos)._M_t._M_impl.super__Rb_tree_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = &this->int2nb;
  p_Var1 = &(this->int2nb)._M_t._M_impl.super__Rb_tree_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->min_intensity = 1;
  if (open_apertures != -1) {
    max_apertures = open_apertures;
  }
  pVVar11 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pVVar6 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this->n_volumes = (int)((ulong)((long)pVVar6 - (long)pVVar11) >> 6);
  local_98.rows_ = 0;
  local_84 = max_apertures;
  while( true ) {
    if ((ulong)((long)pVVar6 - (long)pVVar11 >> 6) <= (ulong)(long)local_98.rows_) break;
    pMVar7 = Volume::getDepositionMatrix(pVVar11 + local_98.rows_,this->angle);
    ppMVar8 = std::
              map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
              ::operator[](local_68,&local_98.rows_);
    *ppMVar8 = pMVar7;
    local_98.rows_ = local_98.rows_ + 1;
    pVVar11 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pVVar6 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  iVar3 = Collimator::getXdim(collimator);
  iVar4 = Collimator::getYdim(collimator);
  maths::Matrix::Matrix(&local_98,iVar3,iVar4);
  maths::Matrix::operator=(local_70,&local_98);
  iVar3 = local_84;
  maths::Matrix::~Matrix(&local_98);
  lVar10 = 0;
  while( true ) {
    iVar4 = Collimator::getXdim(collimator);
    if (iVar4 <= lVar10) break;
    lVar9 = 0;
    while( true ) {
      iVar4 = Collimator::getYdim(collimator);
      if (iVar4 <= lVar9) break;
      bVar2 = Collimator::isActiveBeamAngle(collimator,(int)lVar10,(int)lVar9,this->angle);
      uVar12 = 0;
      if (!bVar2) {
        uVar12 = 0xbff00000;
      }
      (this->I).p[lVar10][lVar9] = (double)((ulong)uVar12 << 0x20);
      lVar9 = lVar9 + 1;
    }
    lVar10 = lVar10 + 1;
  }
  initializeStation(this,setup,iVar3);
  if (myfile != (fstream *)0x0) {
    iVar3 = 0;
    while( true ) {
      iVar4 = Collimator::getXdim(collimator);
      if (iVar4 <= iVar3) break;
      iVar4 = 0;
      while( true ) {
        iVar5 = Collimator::getYdim(collimator);
        if (iVar5 <= iVar4) break;
        std::istream::operator>>((istream *)myfile,&local_98.rows_);
        if (local_98.rows_ != -1) {
          change_intensity(this,iVar3,iVar4,(double)local_98.rows_,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )0x0);
        }
        iVar4 = iVar4 + 1;
      }
      iVar3 = iVar3 + 1;
    }
  }
  (local_38->first).first = -1;
  (local_38->first).second = -1;
  (local_38->second).first = -1;
  (local_38->second).second = -1;
  std::vector<double,_std::allocator<double>_>::operator=(local_78,local_80);
  return;
}

Assistant:

Station::Station(Collimator& collimator, vector<Volume>& volumes, int _angle, int max_apertures,
                   int max_intensity, int initial_intensity, int step_intensity, int open_apertures, int setup, fstream* myfile):
		collimator(collimator), angle(_angle) , max_apertures(max_apertures), A(max_apertures),
		intensity(max_apertures), max_intensity(max_intensity), initial_intensity(initial_intensity),
                step_intensity(step_intensity) {
    
    min_intensity=1;
    if(open_apertures==-1) open_apertures=max_apertures;

    n_volumes=volumes.size();
    for (int i=0; i<volumes.size(); i++)
      D[i]=&volumes[i].getDepositionMatrix(angle);

    // Initialize empty matrix of intensity
    I = Matrix (collimator.getXdim(), collimator.getYdim());
    for (int i=0; i<collimator.getXdim(); i++) {
      for (int j=0; j<collimator.getYdim(); j++) {
        if (collimator.isActiveBeamAngle(i,j,angle)) {
          I(i,j)=0;
        } else {
          I(i,j)=-1;
        }
      }
    }

    // Iniatialize apertures (alternative representation)
    initializeStation(setup, open_apertures);

    if(myfile) {
    	for (int i=0; i<collimator.getXdim(); i++) {
    	   for (int j=0; j<collimator.getYdim(); j++) {
    		   int a; *myfile>>a;
    		   if(a!=-1) change_intensity(i, j, a);
    	   }
    	}
    }

    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_intensity = intensity; 
  }